

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O1

MaybeResult<wasm::Ok> *
wasm::WATParser::table<wasm::WATParser::ParseDeclsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  undefined8 *puVar1;
  _Variant_storage<false,_wasm::WATParser::TableType,_wasm::Err> *this;
  undefined1 *puVar2;
  size_t sVar3;
  TableType type_00;
  bool bVar4;
  _Variant_storage<false,_wasm::WATParser::TableType,_wasm::Err> *p_Var5;
  undefined4 *puVar6;
  _Alloc_hider _Var7;
  ImportNames *import_00;
  _Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *this_00;
  ImportNames *exports_00;
  Type TVar8;
  int iVar9;
  string_view expected;
  string_view expected_00;
  string_view expected_01;
  string_view expected_02;
  Name name;
  undefined1 local_200 [8];
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> exports;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  string local_1b8;
  string local_198;
  string local_178;
  uintptr_t local_158;
  _Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *p_Stack_150;
  _Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *local_148;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  size_t local_138;
  undefined1 local_130 [8];
  MaybeResult<wasm::WATParser::ImportNames> import;
  size_t local_100;
  uintptr_t local_f8;
  undefined1 local_f0 [8];
  MaybeResult<wasm::Ok> type;
  optional<unsigned_int> elems;
  undefined3 uStack_b8;
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0;
  undefined7 uStack_9f;
  undefined8 uStack_98;
  undefined8 *local_90;
  _Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *local_88;
  undefined1 local_80 [8];
  Result<wasm::WATParser::TableType> _val_3;
  MaybeResult<wasm::Ok> _val_2;
  
  sVar3 = (ctx->in).pos;
  expected._M_str = "table";
  expected._M_len = 5;
  bVar4 = Lexer::takeSExprStart(&ctx->in,expected);
  if (!bVar4) {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x01';
    return __return_storage_ptr__;
  }
  Lexer::takeID((optional<wasm::Name> *)local_200,&ctx->in);
  if (exports.val.
      super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>.
      super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
      super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
      super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
      super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
      super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err>._M_u._M_first._M_storage.
      _M_storage[8] == '\0') {
    import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
    super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
    super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
    super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
    super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
    super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>._M_index =
         '\0';
    import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
    super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
    super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
    super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
    super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
    super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>._33_7_ = 0;
    local_100 = 0;
  }
  else {
    import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
    super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
    super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
    super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
    super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
    super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>._32_8_ =
         exports.val.
         super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>.
         super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
         super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
         super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
         super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
         super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err>._M_u._0_8_;
    local_100 = (size_t)local_200;
  }
  local_138 = sVar3;
  inlineExports((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)local_200,&ctx->in)
  ;
  std::__detail::__variant::
  _Copy_ctor_base<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>::
  _Copy_ctor_base((_Copy_ctor_base<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                   *)local_130,
                  (_Copy_ctor_base<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                   *)local_200);
  if (import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>._M_u._24_1_
      == '\x01') {
    puVar2 = (undefined1 *)
             ((long)&type.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8);
    local_f0 = (undefined1  [8])puVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_f0,local_130,
               import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
               _M_u._M_first._M_storage.mod.super_IString.str._M_len + (long)local_130);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
    if (local_f0 == (undefined1  [8])puVar2) {
      *puVar1 = CONCAT71(type.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._9_7_,
                         type.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._8_1_);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
           type.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._16_8_;
    }
    else {
      *(undefined1 (*) [8])
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_f0;
      *(ulong *)((long)&(__return_storage_ptr__->val).
                        super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
           CONCAT71(type.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._9_7_,
                    type.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._8_1_);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
         type.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._0_8_;
    type.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._0_8_ = 0;
    type.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._8_1_ = 0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
    local_f0 = (undefined1  [8])puVar2;
    std::__detail::__variant::
    _Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                       *)local_130);
    goto LAB_00b95bff;
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                     *)local_130);
  inlineImport((MaybeResult<wasm::WATParser::ImportNames> *)local_130,&ctx->in);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>::_Copy_ctor_base
            ((_Copy_ctor_base<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> *)local_f0
             ,(_Copy_ctor_base<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> *)
              local_130);
  if (type.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x02') {
    puVar2 = (undefined1 *)
             ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8);
    _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
    super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
    super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
    super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
    super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
    super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._32_8_ = puVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)
               ((long)&_val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                       super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                       super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> + 0x20),
               local_f0,(undefined1 *)
                        (type.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._0_8_ +
                        (long)local_f0));
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
    if ((undefined1 *)
        _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._32_8_ == puVar2) {
      *puVar1 = CONCAT71(_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._9_7_,
                         _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._8_1_);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
           _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._16_8_;
    }
    else {
      *(undefined8 *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
           _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
           super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
           super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
           super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
           super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
           super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._32_8_;
      *(ulong *)((long)&(__return_storage_ptr__->val).
                        super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
           CONCAT71(_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._9_7_,
                    _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._8_1_);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
         _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._0_8_;
    _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._0_8_ = 0;
    _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._8_1_ = 0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
    _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
    super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
    super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
    super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
    super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
    super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._32_8_ = puVar2;
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> *)
               local_f0);
  }
  else {
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> *)
               local_f0);
    local_f8 = 3;
    expected_00._M_str = "i64";
    expected_00._M_len = 3;
    bVar4 = Lexer::takeKeyword(&ctx->in,expected_00);
    if (!bVar4) {
      local_f8 = 2;
      expected_01._M_str = "i32";
      expected_01._M_len = 3;
      Lexer::takeKeyword(&ctx->in,expected_01);
    }
    maybeReftype<wasm::WATParser::ParseDeclsCtx>((MaybeResult<wasm::Ok> *)local_f0,ctx);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err>::
    _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                    ((long)&_val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                            super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                            super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                            super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> + 0x20),
                    (_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_f0);
    if (_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x02') {
      TVar8.id = (long)&_val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                        super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                        super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                        super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> + 8;
      local_80 = (undefined1  [8])TVar8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_80,
                 _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                 super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                 super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                 super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                 super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._32_8_,
                 _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._0_8_ +
                 _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                 super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                 super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                 super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                 super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._32_8_);
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
      if (local_80 == (undefined1  [8])TVar8.id) {
        *puVar1 = CONCAT71(_val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                           super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._M_u.
                           _M_first._M_storage.limits.initial._1_7_,
                           _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                           super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._M_u.
                           _M_first._M_storage.limits.initial._0_1_);
        *(_Storage<unsigned_long,_true> *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
             _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
             super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
             super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
             super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
             super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
             super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._M_u._M_first.
             _M_storage.limits.max.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_payload;
      }
      else {
        *(undefined1 (*) [8])
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_80;
        *(ulong *)((long)&(__return_storage_ptr__->val).
                          super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
             CONCAT71(_val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                      super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                      super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                      super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                      super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._M_u.
                      _M_first._M_storage.limits.initial._1_7_,
                      _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                      super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                      super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                      super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                      super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._M_u.
                      _M_first._M_storage.limits.initial._0_1_);
      }
      ((Type *)((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8))->id =
           (uintptr_t)
           _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
           super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
           super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
           super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
           super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
           super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._M_u._M_first.
           _M_storage.addressType.id;
      _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._M_u._M_first._M_storage.
      addressType.id = (Type)0;
      _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._M_u._M_first._M_storage.
      limits.initial._0_1_ = 0;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
      local_80 = (undefined1  [8])TVar8;
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                        ((long)&_val_3.val.
                                super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> + 0x20
                        ));
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                        ((long)&_val_3.val.
                                super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> + 0x20
                        ));
      type.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._36_1_ = 0;
      if (type.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x01') {
        tabletypeContinued<wasm::WATParser::ParseDeclsCtx>
                  ((Result<wasm::WATParser::TableType> *)
                   ((long)&_val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> + 0x20),ctx
                   ,(Type)local_f8);
        this = (_Variant_storage<false,_wasm::WATParser::TableType,_wasm::Err> *)
               ((long)&_val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                       super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                       super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> + 0x20);
        std::__detail::__variant::_Copy_ctor_base<false,_wasm::WATParser::TableType,_wasm::Err>::
        _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::TableType,_wasm::Err> *)local_80,
                        (_Copy_ctor_base<false,_wasm::WATParser::TableType,_wasm::Err> *)this);
        if (_val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._M_u._M_first.
            _M_storage.limits.max.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._M_engaged == true) {
          local_b0 = &local_a0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,local_80,
                     (undefined1 *)
                     ((long)_val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                            super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                            super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                            super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                            super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._M_u
                            ._M_first._M_storage.addressType.id + (long)local_80));
          puVar1 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->val).
                           super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
          *(undefined8 **)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
          if (local_b0 == &local_a0) {
            *puVar1 = CONCAT71(uStack_9f,local_a0);
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
                 uStack_98;
          }
          else {
            *(undefined1 **)
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_b0;
            *(ulong *)((long)&(__return_storage_ptr__->val).
                              super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10)
                 = CONCAT71(uStack_9f,local_a0);
          }
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) = local_a8;
          local_a8 = 0;
          local_a0 = 0;
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
          local_b0 = &local_a0;
          std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::TableType,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TableType,_wasm::Err> *)
                            local_80);
          std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::TableType,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TableType,_wasm::Err> *)
                            ((long)&_val_3.val.
                                    super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                    super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> +
                            0x20));
        }
        else {
          std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::TableType,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TableType,_wasm::Err> *)
                            local_80);
          local_f8 = _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                     super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                     super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                     super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                     super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._32_8_;
          p_Var5 = (_Variant_storage<false,_wasm::WATParser::TableType,_wasm::Err> *)0x0;
          if (_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ == '\0') {
            p_Var5 = this;
          }
          this_00 = (_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                    (p_Var5->_M_u)._M_first._M_storage.limits.initial;
          local_88 = (_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                     (p_Var5->_M_u)._M_first._M_storage.limits.max.
                     super__Optional_base<unsigned_long,_true,_true>._M_payload.
                     super__Optional_payload_base<unsigned_long>._M_payload._M_value;
          local_90 = (undefined8 *)
                     CONCAT71(local_90._1_7_,*(undefined1 *)((long)&p_Var5->_M_u + 0x18));
          puVar6 = (undefined4 *)&DAT_00000019;
          if (_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ == '\0') {
            puVar6 = (undefined4 *)
                     ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x11);
          }
          elems.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._4_3_ = SUB43(*puVar6,0);
          elems.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._7_1_ =
               SUB41(*(undefined4 *)((long)puVar6 + 3),0);
          uStack_b8 = (undefined3)((uint)*(undefined4 *)((long)puVar6 + 3) >> 8);
          std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::TableType,_wasm::Err>::
          ~_Variant_storage(this);
LAB_00b957ee:
          bVar4 = Lexer::takeRParen(&ctx->in);
          if (bVar4) {
            exports_00 = (ImportNames *)local_200;
            if (exports.val.
                super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err>._M_u._24_1_ != '\0'
               ) {
              exports_00 = (ImportNames *)0x0;
            }
            import_00 = (ImportNames *)local_130;
            if (import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                _M_u._24_1_ != '\0') {
              import_00 = (ImportNames *)0x0;
            }
            local_158 = local_f8;
            local_148 = local_88;
            uStack_13c = CONCAT31(uStack_b8,
                                  elems.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                                  super__Optional_payload_base<unsigned_int>._7_1_);
            uStack_140 = CONCAT31(elems.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                                  super__Optional_payload_base<unsigned_int>._4_3_,local_90._0_1_);
            type_00.limits.max.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._12_4_ = uStack_13c;
            type_00.limits.max.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._8_4_ = uStack_140;
            type_00.limits.initial = (uint64_t)this_00;
            type_00.addressType.id = local_f8;
            type_00.limits.max.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._M_payload =
                 (_Storage<unsigned_long,_true>)local_88;
            name.super_IString.str._M_str =
                 (char *)import.val.
                         super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         .
                         super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         ._32_8_;
            name.super_IString.str._M_len = local_100;
            p_Stack_150 = this_00;
            ParseDeclsCtx::addTable
                      ((Result<wasm::Ok> *)
                       ((long)&_val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>
                               .super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                               super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                               super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> + 0x20)
                       ,ctx,name,(vector<wasm::Name,_std::allocator<wasm::Name>_> *)exports_00,
                       import_00,type_00,(Index)local_138);
            if (_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x01')
            {
              local_80 = (undefined1  [8])
                         ((long)&_val_3.val.
                                 super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                 super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> + 8);
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_80,
                         _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                         super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._32_8_,
                         _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._0_8_ +
                         _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                         super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._32_8_)
              ;
LAB_00b958c6:
              TVar8.id = (long)&_val_3.val.
                                super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> + 8;
              puVar1 = (undefined8 *)
                       ((long)&(__return_storage_ptr__->val).
                               super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10)
              ;
              *(undefined8 **)
               &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
              if (local_80 == (undefined1  [8])TVar8.id) {
                *puVar1 = CONCAT71(_val_3.val.
                                   super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                   super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                                   super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>
                                   ._M_u._M_first._M_storage.limits.initial._1_7_,
                                   _val_3.val.
                                   super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                   super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                                   super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>
                                   ._M_u._M_first._M_storage.limits.initial._0_1_);
                *(_Storage<unsigned_long,_true> *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
                     _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                     super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                     super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                     super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                     super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._M_u.
                     _M_first._M_storage.limits.max.super__Optional_base<unsigned_long,_true,_true>.
                     _M_payload.super__Optional_payload_base<unsigned_long>._M_payload;
              }
              else {
                *(undefined1 (*) [8])
                 &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                  .super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_80;
                *(ulong *)((long)&(__return_storage_ptr__->val).
                                  super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> +
                          0x10) =
                     CONCAT71(_val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                              super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                              super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                              super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                              super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>.
                              _M_u._M_first._M_storage.limits.initial._1_7_,
                              _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                              super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                              super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                              super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                              super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>.
                              _M_u._M_first._M_storage.limits.initial._0_1_);
              }
              ((Type *)((long)&(__return_storage_ptr__->val).
                               super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8))->
              id = (uintptr_t)
                   _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                   super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                   super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                   super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                   super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._M_u._M_first
                   ._M_storage.addressType.id;
              _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
              super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
              super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
              super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
              super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
              super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._M_u._M_first.
              _M_storage.addressType.id = (Type)0;
              _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
              super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
              super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
              super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
              super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
              super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._M_u._M_first.
              _M_storage.limits.initial._0_1_ = 0;
              *(__index_type *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) =
                   '\x02';
              local_80 = (undefined1  [8])TVar8;
              std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
              ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                                ((long)&_val_3.val.
                                        super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                        super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                        .
                                        super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                        .
                                        super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                                        .
                                        super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                                + 0x20));
            }
            else {
              std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
              ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                                ((long)&_val_3.val.
                                        super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                        super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                        .
                                        super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                        .
                                        super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                                        .
                                        super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                                + 0x20));
              if (type.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._36_1_ == '\x01') {
                ParseDeclsCtx::addImplicitElems
                          ((__index_type *)
                           ((long)&_val_3.val.
                                   super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                   super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> +
                           0x20),ctx,
                           (__index_type *)
                           ((long)&type.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
                if (_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ ==
                    '\x01') {
                  local_80 = (undefined1  [8])
                             ((long)&_val_3.val.
                                     super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                     super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                     .
                                     super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                     .super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> +
                             8);
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_80,
                             _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                             super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                             super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                             super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                             super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>.
                             _32_8_,_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                    super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                    _M_u._0_8_ +
                                    _val_3.val.
                                    super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                    super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                                    super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>
                                    ._32_8_);
                  goto LAB_00b958c6;
                }
                std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
                ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                                  ((long)&_val_3.val.
                                          super__Variant_base<wasm::WATParser::TableType,_wasm::Err>
                                          .
                                          super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                          .
                                          super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                          .
                                          super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                                          .
                                          super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                                  + 0x20));
              }
              *(__index_type *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\0';
            }
          }
          else {
            local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_178,"expected end of table declaration","");
            Lexer::err((Err *)((long)&_val_3.val.
                                      super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                      super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                      .
                                      super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                      .super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                                      .super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                              + 0x20),&ctx->in,&local_178);
            puVar1 = (undefined8 *)
                     ((long)&(__return_storage_ptr__->val).
                             super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
            *(undefined8 **)
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
            puVar2 = (undefined1 *)
                     ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8);
            if ((undefined1 *)
                _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._32_8_ == puVar2
               ) {
              *puVar1 = CONCAT71(_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u.
                                 _9_7_,_val_2.val.
                                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                       ._M_u._8_1_);
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
                   _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._16_8_;
            }
            else {
              *(undefined8 *)
               &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
                   _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                   super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                   super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                   super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                   super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._32_8_;
              *(ulong *)((long)&(__return_storage_ptr__->val).
                                super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10
                        ) = CONCAT71(_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                                     .super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     _M_u._9_7_,
                                     _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                                     .super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     _M_u._8_1_);
            }
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
                 _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._0_8_;
            _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._0_8_ = 0;
            _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._8_1_ = 0;
            *(__index_type *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
            local_1c8._M_allocated_capacity = local_178.field_2._M_allocated_capacity;
            _Var7._M_p = local_178._M_dataplus._M_p;
            _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._32_8_ = puVar2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178._M_dataplus._M_p != &local_178.field_2) goto LAB_00b95af6;
          }
        }
      }
      else {
        expected_02._M_str = "elem";
        expected_02._M_len = 4;
        bVar4 = Lexer::takeSExprStart(&ctx->in,expected_02);
        if (bVar4) {
          if (import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>._M_u
              ._24_1_ == '\x01') {
            local_90 = (undefined8 *)
                       ((long)&(__return_storage_ptr__->val).
                               super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10)
            ;
            local_88 = (_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                       ((ulong)local_88 & 0xffffffff00000000);
            this_00 = (_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                      ((long)&_val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                              super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                              super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                              super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> + 0x20);
            bVar4 = false;
            do {
              maybeElemexpr<wasm::WATParser::ParseDeclsCtx>((MaybeResult<wasm::Ok> *)this_00,ctx);
              iVar9 = 3;
              if (_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ !=
                  '\x01') {
                std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err>::
                _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_80,
                                (_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)this_00);
                if (_val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._M_u.
                    _M_first._M_storage.limits.max.super__Optional_base<unsigned_long,_true,_true>.
                    _M_payload.super__Optional_payload_base<unsigned_long>._M_engaged == true) {
                  local_b0 = &local_a0;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_b0,local_80,
                             (undefined1 *)
                             ((long)_val_3.val.
                                    super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                    super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                                    super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>
                                    ._M_u._M_first._M_storage.addressType.id + (long)local_80));
                  *(undefined8 **)
                   &(__return_storage_ptr__->val).
                    super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_90;
                  if (local_b0 == &local_a0) {
                    *local_90 = CONCAT71(uStack_9f,local_a0);
                    local_90[1] = uStack_98;
                  }
                  else {
                    *(undefined1 **)
                     &(__return_storage_ptr__->val).
                      super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_b0;
                    *(ulong *)((long)&(__return_storage_ptr__->val).
                                      super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>
                              + 0x10) = CONCAT71(uStack_9f,local_a0);
                  }
                  *(undefined8 *)
                   ((long)&(__return_storage_ptr__->val).
                           super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
                       local_a8;
                  local_a8 = 0;
                  local_a0 = 0;
                  *(__index_type *)
                   ((long)&(__return_storage_ptr__->val).
                           super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) =
                       '\x02';
                  local_b0 = &local_a0;
                  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>
                  ::~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                                      local_80);
                  iVar9 = 1;
                }
                else {
                  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>
                  ::~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                                      local_80);
                  local_88 = (_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                             CONCAT44(local_88._4_4_,(int)local_88 + 1);
                  iVar9 = 0;
                  bVar4 = true;
                }
              }
              std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
              ~_Variant_storage(this_00);
            } while (iVar9 == 0);
            if (iVar9 == 3) {
              if (!bVar4) {
                this_00 = (_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                          ((long)&_val_3.val.
                                  super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                  super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> +
                          0x20);
                do {
                  maybeFuncidx<wasm::WATParser::ParseDeclsCtx>((MaybeResult<wasm::Ok> *)this_00,ctx)
                  ;
                  iVar9 = 5;
                  if (_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ !=
                      '\x01') {
                    std::__detail::__variant::
                    _Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err>::_Copy_ctor_base
                              ((_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_80,
                               (_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)this_00);
                    if (_val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                        super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                        super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                        super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                        super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._M_u.
                        _M_first._M_storage.limits.max.
                        super__Optional_base<unsigned_long,_true,_true>._M_payload.
                        super__Optional_payload_base<unsigned_long>._M_engaged == true) {
                      local_b0 = &local_a0;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_b0,local_80,
                                 (undefined1 *)
                                 ((long)_val_3.val.
                                        super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                        super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                        .
                                        super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                        .
                                        super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                                        .
                                        super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                                        .
                                        super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>
                                        ._M_u._M_first._M_storage.addressType.id + (long)local_80));
                      *(undefined8 **)
                       &(__return_storage_ptr__->val).
                        super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_90;
                      if (local_b0 == &local_a0) {
                        *local_90 = CONCAT71(uStack_9f,local_a0);
                        local_90[1] = uStack_98;
                      }
                      else {
                        *(undefined1 **)
                         &(__return_storage_ptr__->val).
                          super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_b0;
                        *(ulong *)((long)&(__return_storage_ptr__->val).
                                          super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                  + 0x10) = CONCAT71(uStack_9f,local_a0);
                      }
                      *(undefined8 *)
                       ((long)&(__return_storage_ptr__->val).
                               super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
                           local_a8;
                      local_a8 = 0;
                      local_a0 = 0;
                      *(__index_type *)
                       ((long)&(__return_storage_ptr__->val).
                               super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20)
                           = '\x02';
                      local_b0 = &local_a0;
                      std::__detail::__variant::
                      _Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::~_Variant_storage
                                ((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                                 local_80);
                      iVar9 = 1;
                    }
                    else {
                      std::__detail::__variant::
                      _Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::~_Variant_storage
                                ((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                                 local_80);
                      local_88 = (_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                                 CONCAT44(local_88._4_4_,(int)local_88 + 1);
                      iVar9 = 0;
                    }
                  }
                  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>
                  ::~_Variant_storage(this_00);
                } while (iVar9 == 0);
                if (iVar9 != 5) goto LAB_00b95be2;
              }
              this_00 = (_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                        ((long)&_val_3.val.
                                super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> + 0x20
                        );
              bVar4 = Lexer::takeRParen(&ctx->in);
              if (bVar4) {
                this_00 = (_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                          ((ulong)local_88 & 0xffffffff);
                type.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_ =
                     (ulong)this_00 | 0x100000000;
                iVar9 = 0;
              }
              else {
                local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_198,"expected end of inline elems","");
                Lexer::err((Err *)((long)&_val_3.val.
                                          super__Variant_base<wasm::WATParser::TableType,_wasm::Err>
                                          .
                                          super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                          .
                                          super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                          .
                                          super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                                          .
                                          super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                                  + 0x20),&ctx->in,&local_198);
                *(undefined8 **)
                 &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                  .super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_90;
                puVar2 = (undefined1 *)
                         ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8);
                if ((undefined1 *)
                    _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._32_8_ ==
                    puVar2) {
                  *local_90 = CONCAT71(_val_2.val.
                                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                       ._M_u._9_7_,
                                       _val_2.val.
                                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                       ._M_u._8_1_);
                  local_90[1] = _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u.
                                _16_8_;
                }
                else {
                  *(undefined8 *)
                   &(__return_storage_ptr__->val).
                    super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
                       _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                       super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                       super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                       super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._32_8_;
                  *(ulong *)((long)&(__return_storage_ptr__->val).
                                    super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                    super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> +
                            0x10) =
                       CONCAT71(_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u.
                                _9_7_,_val_2.val.
                                      super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                      _M_u._8_1_);
                }
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
                     _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._0_8_;
                _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._0_8_ = 0;
                _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._8_1_ = 0;
                *(__index_type *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) =
                     '\x02';
                _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._32_8_ = puVar2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_198._M_dataplus._M_p != &local_198.field_2) {
                  operator_delete(local_198._M_dataplus._M_p,
                                  local_198.field_2._M_allocated_capacity + 1);
                }
                iVar9 = 1;
              }
            }
LAB_00b95be2:
            if (iVar9 == 0) {
              local_90 = (undefined8 *)CONCAT71(local_90._1_7_,1);
              local_88 = this_00;
              goto LAB_00b957ee;
            }
          }
          else {
            local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1b8,"imported tables cannot have inline elements","");
            Lexer::err((Err *)((long)&_val_3.val.
                                      super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                      super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                      .
                                      super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                      .super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                                      .super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                              + 0x20),&ctx->in,&local_1b8);
            puVar1 = (undefined8 *)
                     ((long)&(__return_storage_ptr__->val).
                             super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
            *(undefined8 **)
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
            puVar2 = (undefined1 *)
                     ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8);
            if ((undefined1 *)
                _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._32_8_ == puVar2
               ) {
              *puVar1 = CONCAT71(_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u.
                                 _9_7_,_val_2.val.
                                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                       ._M_u._8_1_);
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
                   _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._16_8_;
            }
            else {
              *(undefined8 *)
               &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
                   _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                   super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                   super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                   super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                   super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._32_8_;
              *(ulong *)((long)&(__return_storage_ptr__->val).
                                super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10
                        ) = CONCAT71(_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                                     .super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     _M_u._9_7_,
                                     _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                                     .super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     _M_u._8_1_);
            }
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
                 _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._0_8_;
            _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._0_8_ = 0;
            _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._8_1_ = 0;
            *(__index_type *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
            local_1c8._M_allocated_capacity = local_1b8.field_2._M_allocated_capacity;
            _Var7._M_p = local_1b8._M_dataplus._M_p;
            _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._32_8_ = puVar2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) goto LAB_00b95af6;
          }
        }
        else {
          exports.val.
          super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>.
          super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
          super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
          super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
          super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
          super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err>._32_8_ = &local_1c8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     ((long)&exports.val.
                             super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                             .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                             super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                             super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                             super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20),
                     "expected table limits or inline elements","");
          Lexer::err((Err *)((long)&_val_3.val.
                                    super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                    super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> +
                            0x20),&ctx->in,
                     (string *)
                     ((long)&exports.val.
                             super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                             .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                             super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                             super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                             super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20));
          puVar1 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->val).
                           super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
          *(undefined8 **)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
          puVar2 = (undefined1 *)
                   ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8);
          if ((undefined1 *)
              _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
              super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
              super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
              super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
              super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
              super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._32_8_ == puVar2)
          {
            *puVar1 = CONCAT71(_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u.
                               _9_7_,_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                                     .super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     _M_u._8_1_);
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
                 _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._16_8_;
          }
          else {
            *(undefined8 *)
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
                 _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                 super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                 super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                 super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                 super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._32_8_;
            *(ulong *)((long)&(__return_storage_ptr__->val).
                              super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10)
                 = CONCAT71(_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._9_7_
                            ,_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u.
                             _8_1_);
          }
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
               _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._0_8_;
          _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._0_8_ = 0;
          _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._8_1_ = 0;
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
          _Var7._M_p = (pointer)exports.val.
                                super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                                .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                                super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                                super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                                super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                                super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err>.
                                _32_8_;
          _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
          super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
          super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
          super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
          super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
          super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._32_8_ = puVar2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)exports.val.
                 super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                 .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                 super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                 super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                 super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                 super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err>._32_8_ !=
              &local_1c8) {
LAB_00b95af6:
            _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._32_8_ =
                 (long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8;
            _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._8_1_ = 0;
            _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._0_8_ = 0;
            operator_delete(_Var7._M_p,local_1c8._M_allocated_capacity + 1);
          }
        }
      }
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_f0);
  }
  std::__detail::__variant::
  _Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> *)
             local_130);
LAB_00b95bff:
  std::__detail::__variant::
  _Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                     *)local_200);
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<> table(Ctx& ctx) {
  auto pos = ctx.in.getPos();
  if (!ctx.in.takeSExprStart("table"sv)) {
    return {};
  }

  Name name;
  if (auto id = ctx.in.takeID()) {
    name = *id;
  }

  auto exports = inlineExports(ctx.in);
  CHECK_ERR(exports);

  auto import = inlineImport(ctx.in);
  CHECK_ERR(import);

  auto addressType = Type::i32;
  if (ctx.in.takeKeyword("i64"sv)) {
    addressType = Type::i64;
  } else {
    ctx.in.takeKeyword("i32"sv);
  }

  // Reftype if we have inline elements.
  auto type = maybeReftype(ctx);
  CHECK_ERR(type);

  std::optional<typename Ctx::TableTypeT> ttype;
  std::optional<typename Ctx::ElemListT> elems;
  if (type) {
    // We should have inline elements.
    if (!ctx.in.takeSExprStart("elem"sv)) {
      return ctx.in.err("expected table limits or inline elements");
    }
    if (import) {
      return ctx.in.err("imported tables cannot have inline elements");
    }

    auto list = ctx.makeElemList(*type);
    bool foundElem = false;
    while (auto elem = maybeElemexpr(ctx)) {
      CHECK_ERR(elem);
      ctx.appendElem(list, *elem);
      foundElem = true;
    }

    // If there were no elemexprs, then maybe we have funcidxs instead.
    if (!foundElem) {
      while (auto func = maybeFuncidx(ctx)) {
        CHECK_ERR(func);
        ctx.appendFuncElem(list, *func);
      }
    }

    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected end of inline elems");
    }
    ttype = ctx.makeTableType(addressType, ctx.getLimitsFromElems(list), *type);
    elems = std::move(list);
  } else {
    auto tabtype = tabletypeContinued(ctx, addressType);
    CHECK_ERR(tabtype);
    ttype = *tabtype;
  }

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of table declaration");
  }

  CHECK_ERR(ctx.addTable(name, *exports, import.getPtr(), *ttype, pos));

  if (elems) {
    CHECK_ERR(ctx.addImplicitElems(*type, std::move(*elems)));
  }

  return Ok{};
}